

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O1

bool helics::BrokerFactory::copyBrokerIdentifier(string_view copyFromName,string_view copyToName)

{
  bool bVar1;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,copyFromName._M_str,copyFromName._M_str + copyFromName._M_len);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,copyToName._M_str,copyToName._M_str + copyToName._M_len);
  bVar1 = gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::copyObject
                    ((SearchableObjectHolder<helics::Broker,_helics::CoreType> *)searchableBrokers,
                     &local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool copyBrokerIdentifier(std::string_view copyFromName, std::string_view copyToName)
{
    return searchableBrokers.copyObject(std::string(copyFromName), std::string(copyToName));
}